

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_os2_v1_info(gdIOCtxPtr infile,bmp_info_t *info)

{
  int iVar1;
  bmp_info_t *info_local;
  gdIOCtxPtr infile_local;
  
  iVar1 = gdGetWordLSB((short *)&info->width,infile);
  if ((((iVar1 == 0) || (iVar1 = gdGetWordLSB((short *)&info->height,infile), iVar1 == 0)) ||
      (iVar1 = gdGetWordLSB(&info->numplanes,infile), iVar1 == 0)) ||
     (iVar1 = gdGetWordLSB(&info->depth,infile), iVar1 == 0)) {
    return 1;
  }
  info->topdown = '\0';
  info->numcolors = 1 << ((byte)info->depth & 0x1f);
  info->type = 1;
  if (((0 < info->width) && (0 < info->height)) &&
     ((0 < info->numplanes && ((0 < info->depth && (-1 < info->numcolors)))))) {
    return 0;
  }
  return 1;
}

Assistant:

static int bmp_read_os2_v1_info(gdIOCtxPtr infile, bmp_info_t *info)
{
	if (
	    !gdGetWordLSB((signed short int *)&info->width, infile) ||
	    !gdGetWordLSB((signed short int *)&info->height, infile) ||
	    !gdGetWordLSB(&info->numplanes, infile) ||
	    !gdGetWordLSB(&info->depth, infile)
	) {
		return 1;
	}

	/* OS2 v1 doesn't support topdown */
	info->topdown = 0;

	info->numcolors = 1 << info->depth;
	info->type = BMP_PALETTE_3;

	if (info->width <= 0 || info->height <= 0 || info->numplanes <= 0 ||
	        info->depth <= 0 || info->numcolors < 0) {
		return 1;
	}

	return 0;
}